

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_statement.cpp
# Opt level: O3

void __thiscall duckdb::PragmaStatement::PragmaStatement(PragmaStatement *this)

{
  _Head_base<0UL,_duckdb::PragmaInfo_*,_false> _Var1;
  
  (this->super_SQLStatement).type = PRAGMA_STATEMENT;
  (this->super_SQLStatement).stmt_location = 0;
  (this->super_SQLStatement).stmt_length = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_buckets =
       &(this->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  (this->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  (this->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&(this->super_SQLStatement).query.field_2;
  (this->super_SQLStatement).query._M_string_length = 0;
  (this->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__PragmaStatement_01981d28;
  _Var1._M_head_impl = (PragmaInfo *)operator_new(0x80);
  *(ParseInfoType *)((long)&(_Var1._M_head_impl)->super_ParseInfo + 8) = PRAGMA_INFO;
  ((_Var1._M_head_impl)->super_ParseInfo)._vptr_ParseInfo = &PTR__PragmaInfo_01977350;
  ((_Var1._M_head_impl)->name)._M_dataplus = (pointer)((long)&(_Var1._M_head_impl)->name + 0x10);
  *(size_type *)((long)&(_Var1._M_head_impl)->name + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var1._M_head_impl)->name + 0x10))->_M_local_buf[0] = '\0';
  *(undefined8 *)
   &((_Var1._M_head_impl)->parameters).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       = 0;
  *(pointer *)((long)&(_Var1._M_head_impl)->parameters + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var1._M_head_impl)->parameters + 0x10) = (pointer)0x0;
  ((_Var1._M_head_impl)->named_parameters)._M_h._M_buckets =
       (__node_base_ptr *)((long)&(_Var1._M_head_impl)->named_parameters + 0x30);
  *(size_type *)((long)&(_Var1._M_head_impl)->named_parameters + 8) = 1;
  ((__node_base *)((long)&(_Var1._M_head_impl)->named_parameters + 0x10))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)((long)&(_Var1._M_head_impl)->named_parameters + 0x18) = 0;
  ((_Prime_rehash_policy *)((long)&(_Var1._M_head_impl)->named_parameters + 0x20))->
  _M_max_load_factor = 1.0;
  *(size_t *)((long)&(_Var1._M_head_impl)->named_parameters + 0x28) = 0;
  *(__node_base_ptr *)((long)&(_Var1._M_head_impl)->named_parameters + 0x30) = (__node_base_ptr)0x0;
  (this->info).super_unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PragmaInfo_*,_std::default_delete<duckdb::PragmaInfo>_>.
  super__Head_base<0UL,_duckdb::PragmaInfo_*,_false>._M_head_impl = _Var1._M_head_impl;
  return;
}

Assistant:

PragmaStatement::PragmaStatement() : SQLStatement(StatementType::PRAGMA_STATEMENT), info(make_uniq<PragmaInfo>()) {
}